

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_decode_field_value
              (amqp_bytes_t encoded,amqp_pool_t *pool,amqp_field_value_t *entry,size_t *offset)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  amqp_bytes_t encoded_02;
  amqp_bytes_t encoded_03;
  amqp_bytes_t encoded_04;
  amqp_bytes_t encoded_05;
  amqp_bytes_t encoded_06;
  amqp_bytes_t encoded_07;
  amqp_bytes_t encoded_08;
  amqp_bytes_t encoded_09;
  amqp_bytes_t encoded_10;
  amqp_bytes_t encoded_11;
  amqp_bytes_t encoded_12;
  amqp_bytes_t encoded_13;
  amqp_bytes_t encoded_14;
  amqp_bytes_t encoded_15;
  amqp_bytes_t encoded_16;
  amqp_bytes_t encoded_17;
  amqp_bytes_t encoded_18;
  int iVar1;
  amqp_table_t *in_RCX;
  amqp_bytes_t *output;
  amqp_pool_t *in_RDX;
  void *in_RSI;
  size_t in_RDI;
  size_t *in_R8;
  uint32_t len;
  uint64_t val_4;
  uint32_t val_3;
  uint16_t val_2;
  uint8_t val_1;
  uint8_t val;
  int res;
  size_t in_stack_ffffffffffffffa8;
  uint8_t *in_stack_ffffffffffffffb0;
  size_t *in_stack_ffffffffffffffb8;
  amqp_table_entry_t_ *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined2 local_30;
  undefined1 local_2e;
  char local_2d;
  int local_2c;
  
  local_2c = -2;
  encoded_00.bytes._0_4_ = in_stack_ffffffffffffffc8;
  encoded_00.len = (size_t)in_stack_ffffffffffffffc0;
  encoded_00.bytes._4_4_ = in_stack_ffffffffffffffcc;
  iVar1 = amqp_decode_8(encoded_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (iVar1 == 0) {
    return -2;
  }
  output = (amqp_bytes_t *)(ulong)((byte)in_RCX->num_entries - 0x41);
  switch(output) {
  case (amqp_bytes_t *)0x0:
    encoded_17.bytes = in_RSI;
    encoded_17.len = in_RDI;
    iVar1 = amqp_decode_array(encoded_17,in_RDX,(amqp_array_t *)in_RCX,in_R8);
    return iVar1;
  case (amqp_bytes_t *)0x1:
    encoded_03.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_03.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_03.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_8(encoded_03,in_stack_ffffffffffffffb8,(uint8_t *)output);
    break;
  default:
    return -2;
  case (amqp_bytes_t *)0x3:
    encoded_12.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_12.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_12.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_8(encoded_12,in_stack_ffffffffffffffb8,(uint8_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    encoded_13.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_13.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_13.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_32(encoded_13,in_stack_ffffffffffffffb8,(uint32_t *)output);
    break;
  case (amqp_bytes_t *)0x5:
    encoded_18.bytes = in_RSI;
    encoded_18.len = in_RDI;
    iVar1 = amqp_decode_table(encoded_18,in_RDX,in_RCX,in_R8);
    return iVar1;
  case (amqp_bytes_t *)0x8:
    encoded_06.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_06.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_06.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_32(encoded_06,in_stack_ffffffffffffffb8,(uint32_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    *(undefined4 *)&in_RCX->entries = in_stack_ffffffffffffffcc;
    goto LAB_00114e10;
  case (amqp_bytes_t *)0xb:
    encoded_09.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_09.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_09.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_64(encoded_09,in_stack_ffffffffffffffb8,(uint64_t *)output);
    break;
  case (amqp_bytes_t *)0x12:
  case (amqp_bytes_t *)0x37:
    encoded_14.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_14.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_14.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_32(encoded_14,in_stack_ffffffffffffffb8,(uint32_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    encoded_15.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_15.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_15.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_bytes(encoded_15,in_stack_ffffffffffffffb8,output,in_stack_ffffffffffffffa8)
    ;
    break;
  case (amqp_bytes_t *)0x13:
    encoded_16.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_16.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_16.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_64(encoded_16,in_stack_ffffffffffffffb8,(uint64_t *)output);
    break;
  case (amqp_bytes_t *)0x15:
    goto LAB_00114e10;
  case (amqp_bytes_t *)0x21:
    encoded_02.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_02.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_02.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_8(encoded_02,in_stack_ffffffffffffffb8,(uint8_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    *(undefined1 *)&in_RCX->entries = local_2e;
    goto LAB_00114e10;
  case (amqp_bytes_t *)0x23:
    encoded_11.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_11.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_11.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_64(encoded_11,in_stack_ffffffffffffffb8,(uint64_t *)output);
    break;
  case (amqp_bytes_t *)0x25:
    encoded_10.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_10.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_10.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_32(encoded_10,in_stack_ffffffffffffffb8,(uint32_t *)output);
    break;
  case (amqp_bytes_t *)0x28:
    encoded_07.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_07.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_07.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_32(encoded_07,in_stack_ffffffffffffffb8,(uint32_t *)output);
    break;
  case (amqp_bytes_t *)0x2b:
    encoded_08.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_08.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_08.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_64(encoded_08,in_stack_ffffffffffffffb8,(uint64_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    in_RCX->entries = in_stack_ffffffffffffffc0;
    goto LAB_00114e10;
  case (amqp_bytes_t *)0x32:
    encoded_04.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_04.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_04.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_16(encoded_04,in_stack_ffffffffffffffb8,(uint16_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    *(undefined2 *)&in_RCX->entries = local_30;
    goto LAB_00114e10;
  case (amqp_bytes_t *)0x33:
    encoded_01.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_01.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_01.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_8(encoded_01,in_stack_ffffffffffffffb8,(uint8_t *)output);
    if (iVar1 == 0) {
      return -2;
    }
    *(uint *)&in_RCX->entries = (uint)(local_2d != '\0');
    goto LAB_00114e10;
  case (amqp_bytes_t *)0x34:
    encoded_05.bytes._0_4_ = in_stack_ffffffffffffffc8;
    encoded_05.len = (size_t)in_stack_ffffffffffffffc0;
    encoded_05.bytes._4_4_ = in_stack_ffffffffffffffcc;
    iVar1 = amqp_decode_16(encoded_05,in_stack_ffffffffffffffb8,(uint16_t *)output);
  }
  if (iVar1 != 0) {
LAB_00114e10:
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

static int amqp_decode_field_value(amqp_bytes_t encoded,
                                   amqp_pool_t *pool,
                                   amqp_field_value_t *entry,
                                   size_t *offset)
{
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_decode_8(encoded, offset, &entry->kind)) {
    goto out;
  }

#define TRIVIAL_FIELD_DECODER(bits) if (!amqp_decode_##bits(encoded, offset, &entry->value.u##bits)) goto out; break
#define SIMPLE_FIELD_DECODER(bits, dest, how) { uint##bits##_t val; if (!amqp_decode_##bits(encoded, offset, &val)) goto out; entry->value.dest = how; } break

  switch (entry->kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    SIMPLE_FIELD_DECODER(8, boolean, val ? 1 : 0);

  case AMQP_FIELD_KIND_I8:
    SIMPLE_FIELD_DECODER(8, i8, (int8_t)val);
  case AMQP_FIELD_KIND_U8:
    TRIVIAL_FIELD_DECODER(8);

  case AMQP_FIELD_KIND_I16:
    SIMPLE_FIELD_DECODER(16, i16, (int16_t)val);
  case AMQP_FIELD_KIND_U16:
    TRIVIAL_FIELD_DECODER(16);

  case AMQP_FIELD_KIND_I32:
    SIMPLE_FIELD_DECODER(32, i32, (int32_t)val);
  case AMQP_FIELD_KIND_U32:
    TRIVIAL_FIELD_DECODER(32);

  case AMQP_FIELD_KIND_I64:
    SIMPLE_FIELD_DECODER(64, i64, (int64_t)val);
  case AMQP_FIELD_KIND_U64:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_F32:
    TRIVIAL_FIELD_DECODER(32);
    /* and by punning, f32 magically gets the right value...! */

  case AMQP_FIELD_KIND_F64:
    TRIVIAL_FIELD_DECODER(64);
    /* and by punning, f64 magically gets the right value...! */

  case AMQP_FIELD_KIND_DECIMAL:
    if (!amqp_decode_8(encoded, offset, &entry->value.decimal.decimals)
        || !amqp_decode_32(encoded, offset, &entry->value.decimal.value)) {
      goto out;
    }
    break;

  case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
  case AMQP_FIELD_KIND_BYTES: {
    uint32_t len;
    if (!amqp_decode_32(encoded, offset, &len)
        || !amqp_decode_bytes(encoded, offset, &entry->value.bytes, len)) {
      goto out;
    }
    break;
  }

  case AMQP_FIELD_KIND_ARRAY:
    res = amqp_decode_array(encoded, pool, &(entry->value.array), offset);
    goto out;

  case AMQP_FIELD_KIND_TIMESTAMP:
    TRIVIAL_FIELD_DECODER(64);

  case AMQP_FIELD_KIND_TABLE:
    res = amqp_decode_table(encoded, pool, &(entry->value.table), offset);
    goto out;

  case AMQP_FIELD_KIND_VOID:
    break;

  default:
    goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}